

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoopStatement.cpp
# Opt level: O0

string * __thiscall
ninx::parser::element::NoopStatement::dump_abi_cxx11_
          (string *__return_storage_ptr__,NoopStatement *this,int level)

{
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  NoopStatement *pNStack_18;
  int level_local;
  NoopStatement *this_local;
  
  local_1c = level;
  pNStack_18 = this;
  this_local = (NoopStatement *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,(long)level,'\t',&local_41);
  std::operator+(__return_storage_ptr__,&local_40," NOOP");
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::NoopStatement::dump(int level) const {
    return std::string(level, '\t')+" NOOP";
}